

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::mouseReleaseEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  MouseButton MVar1;
  AbstractScrollAreaPrivate *pAVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *e_local;
  AbstractScrollArea *this_local;
  
  __fd = (int)e;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  if (MVar1 == LeftButton) {
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    pAVar2->leftMouseButtonPressed = false;
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    if ((((pAVar2->horIndicator->needPaint & 1U) == 0) &&
        (pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                  ::operator->(&this->d), (pAVar2->vertIndicator->needPaint & 1U) == 0)) ||
       ((pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                  ::operator->(&this->d), pAVar2->horIndicator->policy != ScrollIndicatorAsNeeded &&
        (pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                  ::operator->(&this->d), pAVar2->vertIndicator->policy != ScrollIndicatorAsNeeded))
       )) {
      pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
               ::operator->(&this->d);
      AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(pAVar2);
    }
    else {
      pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
               ::operator->(&this->d);
      AbstractScrollAreaPrivate::animateScrollIndicators(pAVar2);
    }
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    AbstractScrollAreaPrivate::animateHiddingBlurEffect(pAVar2);
    QEvent::accept((QEvent *)e,__fd,__addr,in_RCX);
    return;
  }
  QEvent::ignore((QEvent *)e);
  return;
}

Assistant:

void
AbstractScrollArea::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->leftMouseButtonPressed = false;

		if( ( d->horIndicator->needPaint || d->vertIndicator->needPaint ) &&
			( d->horIndicator->policy == ScrollIndicatorAsNeeded ||
				d->vertIndicator->policy == ScrollIndicatorAsNeeded ) )
					d->animateScrollIndicators();
		else
			d->stopScrollIndicatorsAnimation();

		d->animateHiddingBlurEffect();

		e->accept();
	}
	else
		e->ignore();
}